

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O0

_Bool save_png_image_to_file(FILE *fp,image *image)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  __jmp_buf_tag *__env;
  long lVar6;
  void *__ptr;
  void *__ptr_00;
  long lVar7;
  undefined8 uVar8;
  real_t rVar9;
  rgba rVar10;
  rgb rVar11;
  real_t local_b0;
  real_t local_a8;
  real_t rStack_a4;
  rgb pixel_1;
  size_t m_1;
  size_t j_1;
  rgba pixel;
  size_t m;
  size_t j;
  png_byte *row;
  size_t n;
  size_t i;
  size_t stride;
  _Bool has_alpha;
  png_byte *row_bytes;
  png_byte **row_ptrs;
  png_infop info_ptr;
  png_structp png_ptr;
  image *image_local;
  FILE *fp_local;
  
  png_ptr = (png_structp)image;
  image_local = (image *)fp;
  _Var4 = is_rgb_or_rgba_image(image);
  if (!_Var4) {
    __assert_fail("is_rgb_or_rgba_image(image)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/png_image.c"
                  ,0x74,"_Bool save_png_image_to_file(FILE *, const struct image *)");
  }
  info_ptr = (png_infop)png_create_write_struct("1.6.37",0,0);
  if (info_ptr == (png_infop)0x0) {
    fp_local._7_1_ = false;
  }
  else {
    row_ptrs = (png_byte **)png_create_info_struct(info_ptr);
    if (row_ptrs == (png_byte **)0x0) {
      png_destroy_read_struct(&info_ptr,0);
      fp_local._7_1_ = false;
    }
    else {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(info_ptr,longjmp,200);
      iVar5 = _setjmp(__env);
      if (iVar5 == 0) {
        png_init_io(info_ptr,image_local);
        uVar8 = 6;
        if (*(long *)(png_ptr + 0x10) == 3) {
          uVar8 = 2;
        }
        png_set_IHDR(info_ptr,row_ptrs,*(ulong *)png_ptr & 0xffffffff,
                     *(ulong *)(png_ptr + 8) & 0xffffffff,8,uVar8,0,0,0);
        png_write_info(info_ptr,row_ptrs);
        uVar1 = *(ulong *)(png_ptr + 0x10);
        lVar6 = *(long *)png_ptr * *(long *)(png_ptr + 0x10);
        __ptr = xmalloc(*(long *)(png_ptr + 8) << 3);
        __ptr_00 = xmalloc(lVar6 * *(long *)(png_ptr + 8));
        n = 0;
        uVar2 = *(ulong *)(png_ptr + 8);
        for (; n < uVar2; n = n + 1) {
          *(void **)((long)__ptr + n * 8) = (void *)((long)__ptr_00 + lVar6 * n);
          lVar7 = lVar6 * n;
          if (uVar1 < 4) {
            m_1 = 0;
            uVar3 = *(ulong *)png_ptr;
            for (; m_1 < uVar3; m_1 = m_1 + 1) {
              rVar11 = get_rgb_pixel((image *)png_ptr,m_1,n);
              local_b0 = rVar11.b;
              local_a8 = rVar11.r;
              rVar9 = clamp_real(local_a8,0.0,1.0);
              *(char *)((long)__ptr_00 + m_1 * 3 + lVar7) = (char)(int)(rVar9 * 255.0);
              rStack_a4 = rVar11.g;
              rVar9 = clamp_real(rStack_a4,0.0,1.0);
              *(char *)((long)__ptr_00 + m_1 * 3 + lVar7 + 1) = (char)(int)(rVar9 * 255.0);
              rVar9 = clamp_real(local_b0,0.0,1.0);
              *(char *)((long)__ptr_00 + m_1 * 3 + lVar7 + 2) = (char)(int)(rVar9 * 255.0);
            }
          }
          else {
            m = 0;
            uVar3 = *(ulong *)png_ptr;
            for (; m < uVar3; m = m + 1) {
              rVar10 = get_rgba_pixel((image *)png_ptr,m,n);
              j_1._0_4_ = rVar10.r;
              rVar9 = clamp_real((real_t)j_1,0.0,1.0);
              *(char *)((long)__ptr_00 + m * 4 + lVar7) = (char)(int)(rVar9 * 255.0);
              j_1._4_4_ = rVar10.g;
              rVar9 = clamp_real(j_1._4_4_,0.0,1.0);
              *(char *)((long)__ptr_00 + m * 4 + lVar7 + 1) = (char)(int)(rVar9 * 255.0);
              pixel.r = rVar10.b;
              rVar9 = clamp_real(pixel.r,0.0,1.0);
              *(char *)((long)__ptr_00 + m * 4 + lVar7 + 2) = (char)(int)(rVar9 * 255.0);
              pixel.g = rVar10.a;
              rVar9 = clamp_real(pixel.g,0.0,1.0);
              *(char *)((long)__ptr_00 + m * 4 + lVar7 + 3) = (char)(int)(rVar9 * 255.0);
            }
          }
        }
        png_write_image(info_ptr,__ptr);
        free(__ptr);
        free(__ptr_00);
        png_write_end(info_ptr,row_ptrs);
        png_destroy_write_struct(&info_ptr,&row_ptrs);
        fp_local._7_1_ = true;
      }
      else {
        png_destroy_write_struct(&info_ptr,&row_ptrs);
        fp_local._7_1_ = false;
      }
    }
  }
  return fp_local._7_1_;
}

Assistant:

static bool save_png_image_to_file(FILE* fp, const struct image* image) {
    assert(is_rgb_or_rgba_image(image));

    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return false;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return false;
    }

    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_write_struct(&png_ptr, &info_ptr);
        return false;
    }

    png_init_io(png_ptr, fp);
    png_set_IHDR(
        png_ptr, info_ptr,
        image->width, image->height, 8,
        image->channel_count == 3 ? PNG_COLOR_TYPE_RGB : PNG_COLOR_TYPE_RGBA,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);
    png_write_info(png_ptr, info_ptr);

    bool has_alpha = image->channel_count >= 4;
    size_t stride = image->width * image->channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * image->height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * image->height);
    for (size_t i = 0, n = image->height; i < n; ++i) {
        row_ptrs[i] = row_bytes + stride * i;
        png_byte* row = row_bytes + stride * i;
        if (has_alpha) {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgba pixel = get_rgba_pixel(image, j, i);
                row[j * 4 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 4 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 4 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
                row[j * 4 + 3] = clamp_real(pixel.a, 0, 1) * (real_t)255;
            }
        } else {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgb pixel = get_rgb_pixel(image, j, i);
                row[j * 3 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 3 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 3 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
            }
        }
    }
    png_write_image(png_ptr, row_ptrs);
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);
    return true;
}